

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

int __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::init(ZlibCompressor *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  invalid_argument *this_00;
  undefined1 local_80 [4];
  int res;
  ZlibCompressor *local_10;
  ZlibCompressor *this_local;
  
  local_10 = this;
  deflateEnd(&this->zs);
  memset(local_80,0,0x70);
  memcpy(&this->zs,local_80,0x70);
  iVar1 = deflateInit2_(&this->zs,-1,8,-0xf,8,0,"1.2.11",0x70);
  if (iVar1 != 0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"zlib compressor: failure");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return 0;
}

Assistant:

void init() override {
            deflateEnd(&zs);
            zs = {};
            const auto res = deflateInit2(&zs, -1, Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY);
            if(res != Z_OK)
               throw std::invalid_argument{"zlib compressor: failure"};
        }